

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_customMem memManager;
  ZSTD_CCtx *cctx;
  long in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  
  if (((in_stack_00000010 == 0) == (in_stack_00000008 == 0)) &&
     (customMem_00.customFree = (ZSTD_freeFunction)in_stack_00000010,
     customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_00000008,
     customMem_00.opaque = in_stack_00000018,
     cctx = (ZSTD_CCtx *)ZSTD_customMalloc(0xdf8,customMem_00), cctx != (ZSTD_CCtx *)0x0)) {
    memManager.customFree = (ZSTD_freeFunction)in_stack_00000010;
    memManager.customAlloc = (ZSTD_allocFunction)in_stack_00000008;
    memManager.opaque = in_stack_00000018;
    ZSTD_initCCtx(cctx,memManager);
    return cctx;
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_customMalloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        ZSTD_initCCtx(cctx, customMem);
        return cctx;
    }
}